

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

bool __thiscall llvm::StringRef::getAsDouble(StringRef *this,double *Result,bool AllowInexact)

{
  opStatus oVar1;
  double dVar2;
  undefined1 local_48 [4];
  opStatus Status;
  APFloat F;
  bool AllowInexact_local;
  double *Result_local;
  StringRef *this_local;
  
  F.U._23_1_ = AllowInexact;
  APFloat::APFloat((APFloat *)local_48,0.0);
  oVar1 = APFloat::convertFromString((APFloat *)local_48,*this,rmNearestTiesToEven);
  if ((oVar1 == opOK) || (((F.U._23_1_ & 1) != 0 && ((oVar1 & opInexact) != opOK)))) {
    dVar2 = APFloat::convertToDouble((APFloat *)local_48);
    *Result = dVar2;
    this_local._7_1_ = false;
  }
  else {
    this_local._7_1_ = true;
  }
  APFloat::~APFloat((APFloat *)local_48);
  return this_local._7_1_;
}

Assistant:

bool StringRef::getAsDouble(double &Result, bool AllowInexact) const {
  APFloat F(0.0);
  APFloat::opStatus Status =
      F.convertFromString(*this, APFloat::rmNearestTiesToEven);
  if (Status != APFloat::opOK) {
    if (!AllowInexact || !(Status & APFloat::opInexact))
      return true;
  }

  Result = F.convertToDouble();
  return false;
}